

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_task.cpp
# Opt level: O2

MPP_RET hal_task_hnd_set_status(HalTaskHnd hnd,RK_S32 status)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  MPP_RET MVar6;
  undefined8 in_RAX;
  undefined4 uVar7;
  long lVar8;
  undefined8 uVar9;
  
  uVar7 = (undefined4)((ulong)in_RAX >> 0x20);
  if (hnd == (HalTaskHnd)0x0 || 2 < status) {
    _mpp_log_l(2,"hal_task","found invaid input hnd %p status %d\n","hal_task_hnd_set_status",hnd,
               status);
    MVar6 = MPP_ERR_UNKNOW;
  }
  else {
    lVar2 = *(long *)((long)hnd + 0x10);
    if (lVar2 == 0) {
      uVar9 = CONCAT44(uVar7,0xbd);
      _mpp_log_l(2,"hal_task","Assertion %s failed at %s:%d\n",(char *)0x0,"group",
                 "hal_task_hnd_set_status",uVar9);
      uVar7 = (undefined4)((ulong)uVar9 >> 0x20);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0017478c;
    }
    if (*(int *)(lVar2 + 4) <= *(int *)((long)hnd + 0x18)) {
      _mpp_log_l(2,"hal_task","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "impl->index < group->task_count","hal_task_hnd_set_status",CONCAT44(uVar7,0xbe));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0017478c:
        abort();
      }
    }
    mpp_spinlock_lock((spinlock_t *)(lVar2 + 8));
    lVar3 = *hnd;
    plVar4 = *(long **)((long)hnd + 8);
    *(long **)(lVar3 + 8) = plVar4;
    *plVar4 = lVar3;
    *(HalTaskHnd *)((long)hnd + 8) = hnd;
    lVar3 = *(long *)(lVar2 + 0x28);
    lVar8 = (long)status * 0x10;
    puVar5 = *(undefined8 **)(lVar3 + 8 + lVar8);
    *(HalTaskHnd *)(lVar3 + 8 + lVar8) = hnd;
    *(long *)hnd = lVar3 + lVar8;
    *(undefined8 **)((long)hnd + 8) = puVar5;
    *puVar5 = hnd;
    lVar3 = *(long *)(lVar2 + 0x30);
    piVar1 = (int *)(lVar3 + (long)*(int *)((long)hnd + 0x1c) * 4);
    *piVar1 = *piVar1 + -1;
    piVar1 = (int *)(lVar3 + (long)status * 4);
    *piVar1 = *piVar1 + 1;
    *(RK_S32 *)((long)hnd + 0x1c) = status;
    mpp_spinlock_unlock((spinlock_t *)(lVar2 + 8));
    MVar6 = MPP_OK;
  }
  return MVar6;
}

Assistant:

MPP_RET hal_task_hnd_set_status(HalTaskHnd hnd, RK_S32 status)
{
    if (NULL == hnd || status >= TASK_BUTT) {
        mpp_err_f("found invaid input hnd %p status %d\n", hnd, status);
        return MPP_ERR_UNKNOW;
    }

    HalTaskImpl *impl = (HalTaskImpl *)hnd;
    HalTaskGroupImpl *group = impl->group;

    mpp_assert(group);
    mpp_assert(impl->index < group->task_count);

    mpp_spinlock_lock(&group->lock);
    list_del_init(&impl->list);
    list_add_tail(&impl->list, &group->list[status]);
    group->count[impl->status]--;
    group->count[status]++;
    impl->status = status;
    mpp_spinlock_unlock(&group->lock);

    return MPP_OK;
}